

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_integrate_error(REF_GRID ref_grid,REF_DBL *interpolation_error,REF_DBL *total_error)

{
  REF_NODE ref_node_00;
  REF_STATUS RVar1;
  uint uVar2;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ntet;
  double dStack_c0;
  REF_BOOL have_tet;
  REF_DBL volume;
  REF_INT nodes [27];
  int local_40;
  int local_3c;
  REF_INT cell;
  REF_INT cell_node;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_DBL *total_error_local;
  REF_DBL *interpolation_error_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  ref_grid_local._4_4_ =
       ref_cell_ncell(ref_grid->cell[8],ref_node_00,(REF_LONG *)&ref_private_macro_code_rss_1);
  if (ref_grid_local._4_4_ == 0) {
    ntet._4_4_ = (uint)(0 < _ref_private_macro_code_rss_1);
    if (ntet._4_4_ == 0) {
      _cell = ref_grid->cell[3];
    }
    else {
      _cell = ref_grid->cell[8];
    }
    *total_error = 0.0;
    for (local_40 = 0; local_40 < _cell->max; local_40 = local_40 + 1) {
      RVar1 = ref_cell_nodes(_cell,local_40,(REF_INT *)&volume);
      if (RVar1 == 0) {
        if (ntet._4_4_ == 0) {
          uVar2 = ref_node_tri_area(ref_node_00,(REF_INT *)&volume,&stack0xffffffffffffff40);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x41c,"ref_metric_integrate_error",(ulong)uVar2,"area");
            return uVar2;
          }
        }
        else {
          uVar2 = ref_node_tet_vol(ref_node_00,(REF_INT *)&volume,&stack0xffffffffffffff40);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0x41a,"ref_metric_integrate_error",(ulong)uVar2,"vol");
            return uVar2;
          }
        }
        for (local_3c = 0; local_3c < _cell->node_per; local_3c = local_3c + 1) {
          if (ref_node_00->ref_mpi->id == ref_node_00->part[nodes[(long)local_3c + -2]]) {
            *total_error = (interpolation_error[nodes[(long)local_3c + -2]] * dStack_c0) /
                           (double)_cell->node_per + *total_error;
          }
        }
      }
    }
    ref_grid_local._4_4_ = ref_mpi_allsum(ref_grid->mpi,total_error,1,3);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0x426,"ref_metric_integrate_error",(ulong)ref_grid_local._4_4_,"dbl sum");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0x410,
           "ref_metric_integrate_error",(ulong)ref_grid_local._4_4_,"count");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_integrate_error(REF_GRID ref_grid,
                                              REF_DBL *interpolation_error,
                                              REF_DBL *total_error) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell_node, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL volume;
  REF_BOOL have_tet;
  REF_LONG ntet;
  RSS(ref_cell_ncell(ref_grid_tet(ref_grid), ref_node, &ntet), "count");
  have_tet = (0 < ntet);
  if (have_tet) {
    ref_cell = ref_grid_tet(ref_grid);
  } else {
    ref_cell = ref_grid_tri(ref_grid);
  }
  *total_error = 0.0;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (have_tet) {
      RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
    } else {
      RSS(ref_node_tri_area(ref_node, nodes, &volume), "area");
    }
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      if (ref_node_owned(ref_node, nodes[cell_node])) {
        (*total_error) += interpolation_error[nodes[cell_node]] * volume /
                          ((REF_DBL)ref_cell_node_per(ref_cell));
      }
    }
  }
  RSS(ref_mpi_allsum(ref_grid_mpi(ref_grid), total_error, 1, REF_DBL_TYPE),
      "dbl sum");

  return REF_SUCCESS;
}